

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out(ChArchiveExplorer *this,ChNameValue<chrono::ChEnumMapperBase> *bVal)

{
  int iVar1;
  bool bVar2;
  ChEnumMapperBase *pCVar3;
  size_type sVar4;
  reference token;
  char *pcVar5;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar6;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58 [3];
  undefined4 local_3c;
  undefined1 local_38 [8];
  string mstr;
  ChNameValue<chrono::ChEnumMapperBase> *bVal_local;
  ChArchiveExplorer *this_local;
  
  mstr.field_2._8_8_ = bVal;
  pCVar3 = ChNameValue<chrono::ChEnumMapperBase>::value(bVal);
  (*pCVar3->_vptr_ChEnumMapperBase[2])(local_38);
  if (((this->found & 1U) == 0) || ((this->find_all & 1U) != 0)) {
    iVar1 = this->tablevel;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->search_tokens);
    if ((long)iVar1 == sVar4 - 1) {
      token = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->search_tokens,(long)this->tablevel);
      pcVar5 = ChNameValue<chrono::ChEnumMapperBase>::name(bVal);
      bVar2 = MatchName(this,token,pcVar5);
      if (bVar2) {
        this_00 = (ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x38);
        pcVar5 = ChNameValue<chrono::ChEnumMapperBase>::name(bVal);
        pcVar6 = ChNameValue<chrono::ChEnumMapperBase>::flags(bVal);
        ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::ChValueSpecific(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,pcVar5,*pcVar6);
        local_58[0] = this_00;
        std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                  (&this->results,(value_type *)local_58);
        this->found = true;
      }
      local_3c = 0;
    }
    else {
      local_3c = 1;
    }
  }
  else {
    local_3c = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

virtual void out     (ChNameValue<ChEnumMapperBase> bVal) {
            std::string mstr = bVal.value().GetValueAsString();
            if (this->found && !this->find_all) return;
            if (this->tablevel != this->search_tokens.size()-1) return;
            if (this->MatchName(search_tokens[this->tablevel],bVal.name())) {
                this->results.push_back(new ChValueSpecific<std::string>(mstr,bVal.name(),bVal.flags()));
                this->found = true;
            }
      }